

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::core::ConfidentialValue::ConfidentialValue(ConfidentialValue *this,ConfidentialValue *object)

{
  ConfidentialValue *object_local;
  ConfidentialValue *this_local;
  
  this->_vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_003ebf48;
  ByteData::ByteData(&this->data_);
  ByteData::operator=(&this->data_,&object->data_);
  this->version_ = object->version_;
  return;
}

Assistant:

ConfidentialValue::ConfidentialValue(const ConfidentialValue &object) {
  data_ = object.data_;
  version_ = object.version_;
}